

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O2

void ipred_tscpm(pel *dst,int i_dst,pel *src,pel *luma_nb,pel *luma_rec,int i_luma_rec,int uiWidth,
                int uiHeight,int bAbove,int bLeft,int bitDept)

{
  int bitDept_00;
  undefined4 in_register_00000034;
  int b_v;
  int shift;
  int a_u;
  pel *local_8058;
  pel *local_8050;
  undefined8 local_8048;
  int a_v;
  int b_u;
  pel tmp_buf [32768];
  
  local_8048 = CONCAT44(in_register_00000034,i_dst);
  local_8058 = luma_rec;
  local_8050 = dst;
  get_tscpm_params(&a_u,&b_u,&a_v,&b_v,&shift,bAbove,bLeft,uiWidth,uiHeight,bitDept,src,luma_nb);
  tscpm_linear_transform
            (local_8058,i_luma_rec,tmp_buf,uiWidth * 4,a_u,b_u,a_v,b_v,shift,uiWidth * 2,
             uiHeight * 2,bitDept);
  down_sample_uv(uiWidth,uiHeight,bitDept_00,tmp_buf,uiWidth * 4,local_8050,(int)local_8048);
  return;
}

Assistant:

void ipred_tscpm(pel *dst, int i_dst, pel *src, pel* luma_nb, pel *luma_rec, int i_luma_rec, int uiWidth, int uiHeight, int bAbove, int bLeft, int bitDept)
{
    int a_u, b_u, shift;   // parameters of Linear Model : a, b, shift
    int a_v, b_v;
    pel tmp_buf[MAX_CU_SIZE * MAX_CU_SIZE * 2];
    int tmp_stride = uiWidth * 2 * 2;

    get_tscpm_params(&a_u, &b_u, &a_v, &b_v, &shift, bAbove, bLeft, uiWidth, uiHeight, bitDept, src, luma_nb);
    tscpm_linear_transform(luma_rec, i_luma_rec, tmp_buf, tmp_stride, a_u, b_u, a_v, b_v, shift, uiWidth << 1, uiHeight << 1, bitDept);
    down_sample_uv(uiWidth, uiHeight, bitDept, tmp_buf, tmp_stride, dst, i_dst);
}